

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_lt_mpi_ct(mbedtls_mpi *X,mbedtls_mpi *Y,uint *ret)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint Y_is_negative;
  uint X_is_negative;
  uint done;
  uint cond;
  size_t i;
  uint *ret_local;
  mbedtls_mpi *Y_local;
  mbedtls_mpi *X_local;
  
  if (X->n == Y->n) {
    uVar1 = X->s & 2;
    uVar2 = uVar1 ^ Y->s & 2U;
    Y_is_negative = (int)uVar2 >> 1;
    *ret = (int)(uVar2 & uVar1) >> 1;
    for (_done = X->n; _done != 0; _done = _done - 1) {
      uVar2 = ct_lt_mpi_uint(Y->p[_done - 1],X->p[_done - 1]);
      *ret = uVar2 & 1 - Y_is_negative & (int)uVar1 >> 1 | *ret;
      uVar3 = ct_lt_mpi_uint(X->p[_done - 1],Y->p[_done - 1]);
      *ret = uVar3 & 1 - (uVar2 | Y_is_negative) & 1U - ((int)uVar1 >> 1) | *ret;
      Y_is_negative = uVar3 | uVar2 | Y_is_negative;
    }
    X_local._4_4_ = 0;
  }
  else {
    X_local._4_4_ = -4;
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_lt_mpi_ct( const mbedtls_mpi *X, const mbedtls_mpi *Y,
        unsigned *ret )
{
    size_t i;
    /* The value of any of these variables is either 0 or 1 at all times. */
    unsigned cond, done, X_is_negative, Y_is_negative;

    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( Y != NULL );
    MPI_VALIDATE_RET( ret != NULL );

    if( X->n != Y->n )
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;

    /*
     * Set sign_N to 1 if N >= 0, 0 if N < 0.
     * We know that N->s == 1 if N >= 0 and N->s == -1 if N < 0.
     */
    X_is_negative = ( X->s & 2 ) >> 1;
    Y_is_negative = ( Y->s & 2 ) >> 1;

    /*
     * If the signs are different, then the positive operand is the bigger.
     * That is if X is negative (X_is_negative == 1), then X < Y is true and it
     * is false if X is positive (X_is_negative == 0).
     */
    cond = ( X_is_negative ^ Y_is_negative );
    *ret = cond & X_is_negative;

    /*
     * This is a constant-time function. We might have the result, but we still
     * need to go through the loop. Record if we have the result already.
     */
    done = cond;

    for( i = X->n; i > 0; i-- )
    {
        /*
         * If Y->p[i - 1] < X->p[i - 1] then X < Y is true if and only if both
         * X and Y are negative.
         *
         * Again even if we can make a decision, we just mark the result and
         * the fact that we are done and continue looping.
         */
        cond = ct_lt_mpi_uint( Y->p[i - 1], X->p[i - 1] );
        *ret |= cond & ( 1 - done ) & X_is_negative;
        done |= cond;

        /*
         * If X->p[i - 1] < Y->p[i - 1] then X < Y is true if and only if both
         * X and Y are positive.
         *
         * Again even if we can make a decision, we just mark the result and
         * the fact that we are done and continue looping.
         */
        cond = ct_lt_mpi_uint( X->p[i - 1], Y->p[i - 1] );
        *ret |= cond & ( 1 - done ) & ( 1 - X_is_negative );
        done |= cond;
    }

    return( 0 );
}